

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void ym2413_set_mute_mask_emu(void *chip,UINT32 MuteMask)

{
  byte local_21;
  uint8_t curChn;
  EOPLL *opll;
  UINT32 MuteMask_local;
  void *chip_local;
  
  *(undefined4 *)((long)chip + 0xe10) = 0;
  for (local_21 = 0; local_21 < 0xe; local_21 = local_21 + 1) {
    if ((MuteMask >> (local_21 & 0x1f) & 1) != 0) {
      *(uint32_t *)((long)chip + 0xe10) = MUTE_MASK_MAP[local_21] | *(uint *)((long)chip + 0xe10);
    }
  }
  return;
}

Assistant:

static void ym2413_set_mute_mask_emu(void *chip, UINT32 MuteMask)
{
	EOPLL *opll = (EOPLL *)chip;
	uint8_t curChn;
	
	opll->mask = 0;
	for (curChn = 0; curChn < 14; curChn ++)
	{
		if ((MuteMask >> curChn) & 0x01)
			opll->mask |= MUTE_MASK_MAP[curChn];
	}
	
	return;
}